

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

CloningFilter * __thiscall
helics::Federate::registerCloningFilter
          (Federate *this,string_view filterName,string_view inputType,string_view outputType)

{
  ConnectorFederateManager *this_00;
  CloningFilter *pCVar1;
  string_view name;
  string local_40;
  
  this_00 = (this->cManager)._M_t.
            super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
            .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
  localNameGenerator_abi_cxx11_(&local_40,this,filterName);
  name._M_str = local_40._M_dataplus._M_p;
  name._M_len = local_40._M_string_length;
  pCVar1 = ConnectorFederateManager::registerCloningFilter(this_00,name,inputType,outputType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pCVar1;
}

Assistant:

CloningFilter& Federate::registerCloningFilter(std::string_view filterName,
                                               std::string_view inputType,
                                               std::string_view outputType)
{
    return cManager->registerCloningFilter(localNameGenerator(filterName), inputType, outputType);
}